

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  TargetType TVar1;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  TVar1 = GetType(this);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x138f,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FRAMEWORK_VERSION",&local_39);
  __s = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (__s == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"VERSION",&local_39);
    __s = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (__s == (char *)0x0) {
      __s = "A";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (const char* fversion = this->GetProperty("FRAMEWORK_VERSION")) {
    return fversion;
  }
  if (const char* tversion = this->GetProperty("VERSION")) {
    return tversion;
  }
  return "A";
}